

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbcs.c
# Opt level: O0

void write_sbcs(charset_spec_conflict *charset,long input_chr,charset_state *state,
               _func_void_void_ptr_long *emit,void *emitctx)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int c;
  int k;
  int j;
  int i;
  sbcs_data *sd;
  void *emitctx_local;
  _func_void_void_ptr_long *emit_local;
  charset_state *state_local;
  long input_chr_local;
  charset_spec_conflict *charset_local;
  
  pvVar2 = charset->data;
  k = -1;
  iVar3 = *(int *)((long)pvVar2 + 0x900);
  do {
    c = iVar3;
    if (c <= k + 1) {
      (*emit)(emitctx,0xffff);
      return;
    }
    iVar4 = (k + c) / 2;
    bVar1 = *(byte *)((long)pvVar2 + (long)iVar4 + 0x800);
    iVar3 = iVar4;
  } while (((ulong)input_chr < *(ulong *)((long)pvVar2 + (long)(int)(uint)bVar1 * 8)) ||
          (iVar3 = c, k = iVar4,
          *(ulong *)((long)pvVar2 + (long)(int)(uint)bVar1 * 8) < (ulong)input_chr));
  (*emit)(emitctx,(ulong)bVar1);
  return;
}

Assistant:

void write_sbcs(charset_spec const *charset, long int input_chr,
                charset_state *state,
                void (*emit)(void *ctx, long int output), void *emitctx)
{
    const struct sbcs_data *sd = charset->data;
    int i, j, k, c;

    UNUSEDARG(state);

    /*
     * Binary-search in the ucs2sbcs table.
     */
    i = -1;
    j = sd->nvalid;
    while (i+1 < j) {
        k = (i+j)/2;
        c = sd->ucs2sbcs[k];
        if (input_chr < sd->sbcs2ucs[c])
            j = k;
        else if (input_chr > sd->sbcs2ucs[c])
            i = k;
        else {
            emit(emitctx, c);
            return;
        }
    }
    emit(emitctx, ERROR);
}